

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_offset_Test::TestBody
          (HexEncoderTest_test_encode_as_hex_offset_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  internal iVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertHelper AStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_50,0x2202d5,0,0);
  pcVar4 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_30,"\"\"","HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 0, 0, 5)",
             (char (*) [1])0x20fd44,&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = local_30[0];
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x25,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar2 != (internal)0x0) {
    bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_50,0x2202d5,3,0);
    pcVar4 = "";
    testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
              (local_30,"\"\"","HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 3, 0, 5)",
               (char (*) [1])0x20fd44,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar2 = local_30[0];
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_28.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x26,pcVar4);
      testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&AStack_58);
      if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar2 != (internal)0x0) {
      bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_50,0x2202d5,3,5);
      testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
                (local_30,"\"5d7b\"","HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 3, 5, 5)"
                 ,(char (*) [5])0x2202d0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar2 = local_30[0];
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x27,pcVar4);
        testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&AStack_58);
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar2 != (internal)0x0) {
        bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_50,0x2202d5,0,5)
        ;
        testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
                  (local_30,"\"3a60615d7b\"",
                   "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 0, 5, 5)",
                   (char (*) [11])"3a60615d7b",&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_30[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_50);
          if (local_28.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_28.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x28,pcVar4);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&AStack_58);
          if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && ((long *)local_50._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex_offset)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 0, 0, 5));
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 3, 0, 5));
    ASSERT_EQ("5d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 3, 5, 5));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 0, 5, 5));
}